

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall
QtPrivate::QPropertyBindingData::notifyObservers
          (QPropertyBindingData *this,QUntypedPropertyData *propertyDataPtr,QBindingStorage *storage
          )

{
  bool bVar1;
  undefined1 uVar2;
  NotificationResult NVar3;
  QPropertyObserverPointer this_00;
  QPropertyBindingData *pQVar4;
  iterator pQVar5;
  long in_RDX;
  QPropertyBindingData *in_RDI;
  long in_FS_OFFSET;
  QPropertyBindingPrivate *binding;
  QPropertyBindingPrivatePtr *bindingPtr;
  iterator __end3;
  iterator __begin3;
  PendingBindingObserverList *__range3;
  QPropertyObserverPointer observer_1;
  QPropertyObserverPointer observer;
  QPropertyBindingDataPointer d;
  PendingBindingObserverList bindingObservers;
  QPropertyBindingPrivate *in_stack_fffffffffffff718;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  QBindingStorage *in_stack_fffffffffffff728;
  QVarLengthArray<QPropertyBindingPrivatePtr,_256LL> *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  QVarLengthArray<QPropertyBindingPrivatePtr,_256LL> *this_01;
  QUntypedPropertyData *propertyDataPtr_00;
  QPropertyObserverPointer in_stack_fffffffffffff768;
  QPropertyBindingPrivatePtr *local_880;
  QPropertyObserverPointer local_848;
  undefined1 local_840 [32];
  QVarLengthArray<QPropertyBindingPrivatePtr,_256LL> local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isNotificationDelayed(in_RDI);
  if (!bVar1) {
    propertyDataPtr_00 = (QUntypedPropertyData *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = &local_820;
    local_840._24_8_ = in_RDI;
    memset(this_01,0xaa,0x818);
    QVarLengthArray<QPropertyBindingPrivatePtr,_256LL>::QVarLengthArray(this_01);
    local_840._16_8_ = propertyDataPtr_00;
    this_00 = QPropertyBindingDataPointer::firstObserver
                        ((QPropertyBindingDataPointer *)in_stack_fffffffffffff730);
    local_840._16_8_ = this_00;
    bVar1 = QPropertyObserverPointer::operator_cast_to_bool
                      ((QPropertyObserverPointer *)(local_840 + 0x10));
    if (bVar1) {
      local_840._8_8_ = local_840._16_8_;
      NVar3 = notifyObserver_helper
                        ((QPropertyBindingData *)this_00.ptr,propertyDataPtr_00,
                         (QBindingStorage *)this_01,in_stack_fffffffffffff768,
                         (PendingBindingObserverList *)
                         CONCAT44(CONCAT13(bVar1,(int3)in_stack_fffffffffffff744),
                                  in_stack_fffffffffffff740));
      if (NVar3 == Evaluated) {
        if (in_RDX != 0) {
          in_stack_fffffffffffff730 =
               (QVarLengthArray<QPropertyBindingPrivatePtr,_256LL> *)local_840;
          pQVar4 = QBindingStorage::bindingData
                             (in_stack_fffffffffffff728,
                              (QUntypedPropertyData *)
                              CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720));
          (in_stack_fffffffffffff730->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase
          .a = (qsizetype)pQVar4;
          local_840._24_8_ = local_840._0_8_;
        }
        local_848.ptr = (QPropertyObserver *)&DAT_aaaaaaaaaaaaaaaa;
        local_848 = QPropertyBindingDataPointer::firstObserver
                              ((QPropertyBindingDataPointer *)in_stack_fffffffffffff730);
        uVar2 = QPropertyObserverPointer::operator_cast_to_bool(&local_848);
        if ((bool)uVar2) {
          QPropertyObserverPointer::notify
                    ((QPropertyObserverPointer *)this_00.ptr,propertyDataPtr_00);
        }
        local_880 = QVLABase<QPropertyBindingPrivatePtr>::begin
                              ((QVLABase<QPropertyBindingPrivatePtr> *)0x4145ef);
        pQVar5 = QVLABase<QPropertyBindingPrivatePtr>::end
                           ((QVLABase<QPropertyBindingPrivatePtr> *)
                            CONCAT17(uVar2,in_stack_fffffffffffff720));
        for (; local_880 != pQVar5; local_880 = local_880 + 1) {
          QPropertyBindingPrivatePtr::get(local_880);
          QPropertyBindingPrivate::notifyNonRecursive(in_stack_fffffffffffff718);
        }
      }
    }
    QVarLengthArray<QPropertyBindingPrivatePtr,_256LL>::~QVarLengthArray(in_stack_fffffffffffff730);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyBindingData::notifyObservers(QUntypedPropertyData *propertyDataPtr, QBindingStorage *storage) const
{
    if (isNotificationDelayed())
        return;
    QPropertyBindingDataPointer d{this};

    PendingBindingObserverList bindingObservers;
    if (QPropertyObserverPointer observer = d.firstObserver()) {
        if (notifyObserver_helper(propertyDataPtr, storage, observer, bindingObservers) == Evaluated) {
            /* evaluateBindings() can trash the observers. We need to re-fetch here.
             "this" might also no longer be valid in case we have a QObjectBindableProperty
             and consequently d isn't either (this happens when binding evaluation has
             caused the binding storage to resize.
             If storage is nullptr, then there is no dynamically resizable storage,
             and we cannot run into the issue.
            */
            if (storage)
                d = QPropertyBindingDataPointer {storage->bindingData(propertyDataPtr)};
            if (QPropertyObserverPointer observer = d.firstObserver())
                observer.notify(propertyDataPtr);
            for (auto &&bindingPtr: bindingObservers) {
                auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
                binding->notifyNonRecursive();
            }
        }
    }
}